

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

bool transform_rellocs(vector<char,_std::allocator<char>_> *raw,
                      vector<explode::rellocation,_std::allocator<explode::rellocation>_> *out)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  rellocation local_34;
  
  uVar3 = (long)(raw->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(raw->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((uVar3 & 3) == 0) {
    for (uVar2 = 0; uVar3 >> 2 != uVar2; uVar2 = uVar2 + 1) {
      local_34 = *(rellocation *)
                  ((raw->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar2 * 4);
      std::vector<explode::rellocation,_std::allocator<explode::rellocation>_>::
      emplace_back<explode::rellocation>(out,&local_34);
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"rellocations area size should be divisible by 4"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return (uVar3 & 3) == 0;
}

Assistant:

static bool transform_rellocs(const std::vector <char> raw, std::vector <explode::rellocation>& out)
{
	const std::size_t sz = raw.size();
	if (sz % 4)
	{
		std::cout << "rellocations area size should be divisible by 4" << std::endl;
		return false;
	}
	for (std::size_t i = 0; i < sz / 4; i++)
	{
		const char* rel_b = &raw[4 * i];
		const char* seg_b = &raw[4 * i + 2];
		union
		{
			const uint16_t* words;
			const char*     bytes;
		} u;
		u.bytes = rel_b;
		uint16_t rel = *u.words;
		u.bytes = seg_b;
		uint16_t seg = *u.words;
		out.push_back(explode::rellocation(seg, rel));
	}
	return true;
}